

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O3

int __thiscall dg::BBlock<dg::LLVMNode>::remove(BBlock<dg::LLVMNode> *this,char *__filename)

{
  LLVMNode *this_00;
  DependenceGraph<dg::LLVMNode> *this_01;
  int extraout_EAX;
  _List_node_base *p_Var1;
  
  isolate(this);
  if ((DependenceGraph<dg::LLVMNode> *)this->dg != (DependenceGraph<dg::LLVMNode> *)0x0) {
    DependenceGraph<dg::LLVMNode>::removeBlock((DependenceGraph<dg::LLVMNode> *)this->dg,this->key);
    if (*(BBlock<dg::LLVMNode> **)(this->dg + 0x90) == this) {
      *(undefined8 *)(this->dg + 0x90) = 0;
    }
  }
  if ((char)__filename != '\0') {
    for (p_Var1 = (this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        p_Var1 != (_List_node_base *)&this->nodes; p_Var1 = p_Var1->_M_next) {
      this_00 = (LLVMNode *)p_Var1[1]._M_next;
      (this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).basicBlock =
           (BBlock<dg::LLVMNode> *)0x0;
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeOutcomingCDs
                ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)this_00);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeIncomingCDs
                ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)this_00);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeOutcomingDDs
                ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)this_00);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeIncomingDDs
                ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)this_00);
      this_01 = (DependenceGraph<dg::LLVMNode> *)
                (this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg;
      DependenceGraph<dg::LLVMNode>::_removeNode
                (this_01,(this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>)
                         .key,&this_01->nodes);
      LLVMNode::~LLVMNode(this_00);
      operator_delete(this_00,0x1f0);
    }
  }
  ~BBlock(this);
  operator_delete(this,0x208);
  return extraout_EAX;
}

Assistant:

void remove(bool with_nodes = true) {
        // do not leave any dangling reference
        isolate();

        if (dg) {
#ifndef NDEBUG
            bool ret =
#endif
                    dg->removeBlock(key);
            assert(ret && "BUG: block was not in DG");
            if (dg->getEntryBB() == this)
                dg->setEntryBB(nullptr);
        }

        if (with_nodes) {
            for (NodeT *n : nodes) {
                // we must set basic block to nullptr
                // otherwise the node will try to remove the
                // basic block again if it is of size 1
                n->setBasicBlock(nullptr);

                // remove dependency edges, let be CFG edges
                // as we'll destroy all the nodes
                n->removeCDs();
                n->removeDDs();
                // remove the node from dg
                assert(n->getDG());
                n->getDG()->removeNode(n);

                delete n;
            }
        }

        delete this;
    }